

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O0

void Terminate(PaUtilHostApiRepresentation *hostApi)

{
  PaSkeletonHostApiRepresentation *skeletonHostApi;
  PaUtilHostApiRepresentation *hostApi_local;
  
  if (hostApi[3].Terminate != (_func_void_PaUtilHostApiRepresentation_ptr *)0x0) {
    PaUtil_FreeAllAllocations((PaUtilAllocationGroup *)hostApi[3].Terminate);
    PaUtil_DestroyAllocationGroup((PaUtilAllocationGroup *)hostApi[3].Terminate);
  }
  PaUtil_FreeMemory(hostApi);
  return;
}

Assistant:

static void Terminate( struct PaUtilHostApiRepresentation *hostApi )
{
    PaSkeletonHostApiRepresentation *skeletonHostApi = (PaSkeletonHostApiRepresentation*)hostApi;

    /*
        IMPLEMENT ME:
            - clean up any resources not handled by the allocation group
    */

    if( skeletonHostApi->allocations )
    {
        PaUtil_FreeAllAllocations( skeletonHostApi->allocations );
        PaUtil_DestroyAllocationGroup( skeletonHostApi->allocations );
    }

    PaUtil_FreeMemory( skeletonHostApi );
}